

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrOperator,bool>
               (string_t *ldata,string_t *rdata,long *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  bool bVar4;
  byte bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  idx_t iVar9;
  utf8proc_ssize_t uVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  ulong uVar12;
  long lVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  sel_t *psVar15;
  utf8proc_ssize_t len;
  idx_t iVar16;
  utf8proc_uint8_t *str;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  undefined1 local_88 [16];
  sel_t *local_78;
  utf8proc_int32_t local_6c;
  string_t *local_68;
  string_t *local_60;
  long *local_58;
  ulong local_50;
  anon_union_16_2_67f50693_for_value local_48;
  buffer_ptr<ValidityBuffer> *local_38;
  
  local_68 = ldata;
  local_60 = rdata;
  local_58 = result_data;
  local_50 = count;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar15 = lsel->sel_vector;
      local_78 = rsel->sel_vector;
      uVar14 = 0;
      do {
        uVar8 = uVar14;
        if (psVar15 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar15[uVar14];
        }
        uVar12 = uVar14;
        if (local_78 != (sel_t *)0x0) {
          uVar12 = (ulong)local_78[uVar14];
        }
        local_88._0_8_ = *(undefined8 *)&local_68[uVar8].value;
        local_88._8_8_ = local_68[uVar8].value.pointer.ptr;
        local_48._0_8_ = *(undefined8 *)&local_60[uVar12].value;
        local_48.pointer.ptr = local_60[uVar12].value.pointer.ptr;
        iVar9 = FindStrInStr((string_t *)local_88,(string_t *)&local_48.pointer);
        if (iVar9 == 0xffffffffffffffff) {
          lVar13 = 0;
        }
        else if ((long)iVar9 < 1) {
          lVar13 = 1;
        }
        else {
          str = local_88 + 4;
          if (0xc < (uint)local_88._0_4_) {
            str = (utf8proc_uint8_t *)local_88._8_8_;
          }
          lVar13 = 1;
          do {
            uVar10 = utf8proc_iterate(str,iVar9,&local_6c);
            str = str + uVar10;
            lVar13 = lVar13 + 1;
            iVar16 = iVar9 - uVar10;
            bVar4 = uVar10 <= (long)iVar9;
            iVar9 = iVar16;
          } while (iVar16 != 0 && bVar4);
        }
        local_58[uVar14] = lVar13;
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_50);
    }
  }
  else if (count != 0) {
    psVar15 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    local_38 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar14 = 0;
    local_78 = psVar15;
    do {
      uVar8 = uVar14;
      if (psVar15 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar15[uVar14];
      }
      uVar12 = uVar14;
      if (psVar2 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar2[uVar14];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) &&
         ((puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)))) {
        local_88._0_8_ = *(undefined8 *)&local_68[uVar8].value;
        local_88._8_8_ = local_68[uVar8].value.pointer.ptr;
        local_48._0_8_ = *(undefined8 *)&local_60[uVar12].value;
        local_48.pointer.ptr = local_60[uVar12].value.pointer.ptr;
        iVar9 = FindStrInStr((string_t *)local_88,(string_t *)&local_48.pointer);
        if (iVar9 == 0xffffffffffffffff) {
          lVar13 = 0;
        }
        else if ((long)iVar9 < 1) {
          lVar13 = 1;
        }
        else {
          p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 4);
          if (0xc < (uint)local_88._0_4_) {
            p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
          }
          lVar13 = 1;
          do {
            uVar10 = utf8proc_iterate((utf8proc_uint8_t *)p_Var17,iVar9,&local_6c);
            p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&p_Var17->_vptr__Sp_counted_base + uVar10);
            lVar13 = lVar13 + 1;
            iVar16 = iVar9 - uVar10;
            bVar4 = uVar10 <= (long)iVar9;
            iVar9 = iVar16;
          } while (iVar16 != 0 && bVar4);
        }
        local_58[uVar14] = lVar13;
        psVar15 = local_78;
        count = local_50;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_48._0_8_ = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_88,(unsigned_long *)&local_48);
          uVar7 = local_88._8_8_;
          uVar6 = local_88._0_8_;
          local_88._0_8_ = (element_type *)0x0;
          local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var17 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar6;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
          if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          }
          pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_38);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar11->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar5 = (byte)uVar14 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar14 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != count);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}